

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O1

void polyscope::showDelayedWarnings(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  ostream *poVar3;
  WarningMessage *__p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  type func;
  undefined1 local_a0 [40];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,int> local_78 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [16];
  char *local_50;
  char local_40 [16];
  
  if ((anonymous_namespace)::showingWarning == '\0') {
    while (pbVar1 = DAT_004c0900,
          (DAT_004c0920 - _DAT_004c0928 >> 3) * -0x71c71c71c71c71c7 +
          ((DAT_004c0938 - DAT_004c0918 >> 3) + -1 + (ulong)(DAT_004c0938 == 0)) * 7 !=
          ((long)DAT_004c0910 - (long)DAT_004c0900 >> 3) * 0x71c71c71c71c71c7) {
      (anonymous_namespace)::showingWarning = 1;
      if (0 < options::verbosity) {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,options::printPrefix_abi_cxx11_,DAT_004bdc60);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[WARNING] ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
        iVar2 = std::__cxx11::string::compare((char *)(pbVar1 + 1));
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," --- ",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,pbVar1[1]._M_dataplus._M_p,pbVar1[1]._M_string_length);
        }
        if (0 < *(int *)&pbVar1[2]._M_dataplus._M_p) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (and ",6);
          poVar3 = (ostream *)
                   std::ostream::operator<<(&std::cout,*(int *)&pbVar1[2]._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," similar messages).",0x13);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
      }
      local_a0._32_8_ = anon_unknown_1::buildWarningUI;
      std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,int>::
      _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,int&,void>
                (local_78,pbVar1,pbVar1 + 1,(int *)(pbVar1 + 2));
      std::function<void()>::
      function<std::_Bind<void(*(std::__cxx11::string,std::__cxx11::string,int))(std::__cxx11::string,std::__cxx11::string,int)>&,void>
                ((function<void()> *)local_a0,
                 (_Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
                  *)(local_a0 + 0x20));
      __p = (WarningMessage *)0x0;
      pushContext((function<void_()> *)local_a0,false);
      if ((code *)local_a0._16_8_ != (code *)0x0) {
        __p = (WarningMessage *)local_a0;
        (*(code *)local_a0._16_8_)((WarningMessage *)local_a0,(WarningMessage *)local_a0,3);
      }
      pbVar1 = DAT_004c0900;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (DAT_004c0910 + -0x48);
      std::allocator_traits<std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>::
      destroy<polyscope::(anonymous_namespace)::WarningMessage>((allocator_type *)DAT_004c0900,__p);
      if (pbVar1 == pbVar4) {
        operator_delete(_DAT_004c0908);
        DAT_004c0900 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (DAT_004c0918 + 8);
        DAT_004c0910 = (undefined1 *)((long)&DAT_004c0900[0xf].field_2 + 8);
        _DAT_004c0908 = DAT_004c0900;
        DAT_004c0918 = DAT_004c0918 + 8;
      }
      else {
        DAT_004c0900 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &DAT_004c0900[2]._M_string_length;
      }
      (anonymous_namespace)::showingWarning = '\0';
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if ((undefined1 *)local_70._M_allocated_capacity != local_60) {
        operator_delete((void *)local_70._M_allocated_capacity);
      }
    }
  }
  return;
}

Assistant:

void showDelayedWarnings() {

  if (showingWarning) {
    return;
  }

  while (warningMessages.size() > 0) {
    showingWarning = true;
    WarningMessage& currMessage = warningMessages.front();

    if (options::verbosity > 0) {
      std::cout << options::printPrefix << "[WARNING] " << currMessage.baseMessage;
      if (currMessage.detailMessage != "") std::cout << " --- " << currMessage.detailMessage;
      if (currMessage.repeatCount > 0) std::cout << " (and " << currMessage.repeatCount << " similar messages).";
      std::cout << std ::endl;
    }

    auto func = std::bind(buildWarningUI, currMessage.baseMessage, currMessage.detailMessage, currMessage.repeatCount);
    pushContext(func, false);

    warningMessages.pop_front();
    showingWarning = false;
  }
}